

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_mem_stream.cpp
# Opt level: O1

void __thiscall
dpfb::streams::ConstMemStream::seek(ConstMemStream *this,int64_t offset,SeekOrigin origin)

{
  StreamError *this_00;
  
  if (origin == end) {
    offset = offset + this->dataSize;
  }
  else if (origin == cur) {
    offset = offset + this->pos;
  }
  if (-1 < offset) {
    this->pos = offset;
    return;
  }
  this_00 = (StreamError *)__cxa_allocate_exception(0x10);
  StreamError::runtime_error(this_00,"Offset points before the beginning");
  __cxa_throw(this_00,&StreamError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ConstMemStream::seek(std::int64_t offset, SeekOrigin origin)
{
    switch (origin) {
        case SeekOrigin::set:
            break;
        case SeekOrigin::cur:
            offset += pos;
            break;
        case SeekOrigin::end:
            offset += dataSize;
            break;
    }

    if (offset < 0)
        throw StreamError("Offset points before the beginning");

    pos = offset;
}